

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# focuser_state.cpp
# Opt level: O1

void __thiscall FS::Focuser::doCaps(Focuser *this,CommandPacket cp)

{
  DebugInterface *pDVar1;
  NetInterface *pNVar2;
  ulong uVar3;
  char *pcVar4;
  
  pDVar1 = (this->debugLog)._M_t.
           super___uniq_ptr_impl<DebugInterface,_std::default_delete<DebugInterface>_>._M_t.
           super__Tuple_impl<0UL,_DebugInterface_*,_std::default_delete<DebugInterface>_>.
           super__Head_base<0UL,_DebugInterface_*,_false>._M_head_impl;
  (**pDVar1->_vptr_DebugInterface)(pDVar1,"Processing capabilities request\n",0x20);
  pNVar2 = (this->net)._M_t.super___uniq_ptr_impl<NetInterface,_std::default_delete<NetInterface>_>.
           _M_t.super__Tuple_impl<0UL,_NetInterface_*,_std::default_delete<NetInterface>_>.
           super__Head_base<0UL,_NetInterface_*,_false>._M_head_impl;
  (*pNVar2->_vptr_NetInterface[4])(pNVar2,"MaxPos: ",8);
  pNVar2 = ::operator<<(pNVar2,(this->buildParams).maxAbsPos);
  (*pNVar2->_vptr_NetInterface[4])(pNVar2,"\n",1);
  pNVar2 = (this->net)._M_t.super___uniq_ptr_impl<NetInterface,_std::default_delete<NetInterface>_>.
           _M_t.super__Tuple_impl<0UL,_NetInterface_*,_std::default_delete<NetInterface>_>.
           super__Head_base<0UL,_NetInterface_*,_false>._M_head_impl;
  (*pNVar2->_vptr_NetInterface[4])(pNVar2,"CanHome: ",9);
  uVar3 = (ulong)(this->buildParams).focuserHasHome;
  pcVar4 = "NO\n";
  if (uVar3 != 0) {
    pcVar4 = "YES\n";
  }
  (*pNVar2->_vptr_NetInterface[4])(pNVar2,pcVar4,uVar3 + 3);
  return;
}

Assistant:

void Focuser::doCaps( CommandParser::CommandPacket cp )
{
  (void) cp;
  DebugInterface& log = *debugLog;

  log << "Processing capabilities request\n";
  *net << "MaxPos: " << buildParams.maxAbsPos << "\n";
  *net << "CanHome: " << (buildParams.focuserHasHome ? "YES\n" : "NO\n" );
}